

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O3

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSuccessorForAction
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *current_state,int *anchor_location,char action
          ,SlidingPuzzleState *successor_state)

{
  long lVar1;
  bool bVar2;
  pointer pvVar3;
  long *plVar4;
  int iVar5;
  undefined7 in_register_00000009;
  long lVar6;
  undefined4 *puVar7;
  long lVar8;
  
  iVar5 = (int)CONCAT71(in_register_00000009,action);
  if (iVar5 < 0x53) {
    if (iVar5 == 0x45) {
      if (anchor_location[1] == puzzle_size + -1) goto LAB_00108500;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&successor_state->state_,
                  &((current_state->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->state_);
      lVar1 = (long)(((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (successor_state->state_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)
       (*(long *)&pvVar3[*anchor_location].super__Vector_base<int,_std::allocator<int>_>._M_impl + 4
       + (long)anchor_location[1] * 4) =
           *(undefined4 *)
            (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
      lVar8 = (long)*anchor_location * 0x18;
      lVar6 = (long)anchor_location[1];
      puVar7 = (undefined4 *)(*(long *)(lVar1 + lVar8) + lVar6 * 4 + 4);
LAB_001084f1:
      plVar4 = (long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                       lVar8);
    }
    else {
      if (*anchor_location == 0) goto LAB_00108500;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&successor_state->state_,
                  &((current_state->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->state_);
      lVar1 = (long)(((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (successor_state->state_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)
       (*(long *)&pvVar3[(long)*anchor_location + -1].super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl + (long)anchor_location[1] * 4) =
           *(undefined4 *)
            (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
      lVar8 = (long)*anchor_location * 0x18;
      lVar6 = (long)anchor_location[1];
      puVar7 = (undefined4 *)(lVar6 * 4 + *(long *)(lVar1 + -0x18 + lVar8));
LAB_00108499:
      plVar4 = (long *)((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                       lVar8);
    }
    *(undefined4 *)(*plVar4 + lVar6 * 4) = *puVar7;
    bVar2 = true;
  }
  else {
    if (iVar5 == 0x53) {
      if (*anchor_location != puzzle_size + -1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&successor_state->state_,
                    &((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_);
        lVar1 = (long)(((current_state->
                        super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (successor_state->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)
         (*(long *)&pvVar3[(long)*anchor_location + 1].super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl + (long)anchor_location[1] * 4) =
             *(undefined4 *)
              (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
        lVar8 = (long)*anchor_location * 0x18;
        lVar6 = (long)anchor_location[1];
        puVar7 = (undefined4 *)(lVar6 * 4 + *(long *)(lVar1 + 0x18 + lVar8));
        goto LAB_00108499;
      }
    }
    else if (anchor_location[1] != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&successor_state->state_,
                  &((current_state->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->state_);
      lVar1 = (long)(((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (successor_state->state_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)
       (*(long *)&pvVar3[*anchor_location].super__Vector_base<int,_std::allocator<int>_>._M_impl +
        -4 + (long)anchor_location[1] * 4) =
           *(undefined4 *)
            (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
      lVar8 = (long)*anchor_location * 0x18;
      lVar6 = (long)anchor_location[1];
      puVar7 = (undefined4 *)(*(long *)(lVar1 + lVar8) + lVar6 * 4 + -4);
      goto LAB_001084f1;
    }
LAB_00108500:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SlidingPuzzle::generateSuccessorForAction(const SlidingPuzzleStatePtr& current_state,
                                               const int* anchor_location,
                                               const char action,
                                               SlidingPuzzleState& successor_state)
{

  switch(action)
  {
    case 'N':
      if (anchor_location[0]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]-1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]-1][anchor_location[1]];
        return true;
      }
    case 'E':
      if (anchor_location[1]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]+1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]+1];
        return true;
      }
    case 'W':
      if (anchor_location[1]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]-1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]-1];
        return true;
      }
    case 'S':
      if (anchor_location[0]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]+1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]+1][anchor_location[1]];
        return true;
      }
  }
}